

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_ConvertAudio(SDL12_AudioCVT *cvt12)

{
  SDL20_ConvertAudio_t p_Var1;
  SDL_AudioCVT *pSVar2;
  undefined1 local_94 [8];
  SDL_AudioCVT cvt20;
  int retval;
  SDL12_AudioCVT *cvt12_local;
  
  p_Var1 = SDL20_ConvertAudio;
  cvt20.filters[9]._4_4_ = 0;
  unique0x100000ea = cvt12;
  if (cvt12->buf == (Uint8 *)0x0) {
    cvt20.filters[9]._4_4_ = (*SDL20_SetError)("No buffer allocated for conversion");
  }
  else if (WantCompatibilityAudioCVT == SDL_FALSE) {
    pSVar2 = AudioCVT12to20(cvt12,(SDL_AudioCVT *)local_94);
    cvt20.filters[9]._4_4_ = (*p_Var1)(pSVar2);
    AudioCVT20to12((SDL_AudioCVT *)local_94,stack0xfffffffffffffff0);
  }
  else {
    cvt12->len_cvt = cvt12->len;
    cvt12->filter_index = 0;
    if (cvt12->filters[0] != (SDL12_AudioCVTFilter)0x0) {
      (*cvt12->filters[0])(cvt12,cvt12->src_format);
    }
  }
  return cvt20.filters[9]._4_4_;
}

Assistant:

SDLCALL
SDL_ConvertAudio(SDL12_AudioCVT *cvt12)
{
    int retval = 0;

    if (!cvt12->buf) {  /* neither SDL 1.2 nor 2.0 makes sure cvt12 isn't NULL here.  :/  */
        retval = SDL20_SetError("No buffer allocated for conversion");
    } else if (!WantCompatibilityAudioCVT) {
        SDL_AudioCVT cvt20;
        retval = SDL20_ConvertAudio(AudioCVT12to20(cvt12, &cvt20));
        AudioCVT20to12(&cvt20, cvt12);
    } else {
        cvt12->len_cvt = cvt12->len;
        cvt12->filter_index = 0;
        if (cvt12->filters[0]) {
            cvt12->filters[0](cvt12, cvt12->src_format);
        }
    }

    return retval;
}